

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O2

void __thiscall QNetworkRequest::setPriority(QNetworkRequest *this,Priority priority)

{
  QNetworkRequestPrivate *pQVar1;
  
  pQVar1 = QSharedDataPointer<QNetworkRequestPrivate>::operator->(&this->d);
  pQVar1->priority = priority;
  return;
}

Assistant:

void QNetworkRequest::setPriority(Priority priority)
{
    d->priority = priority;
}